

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_thread.cpp
# Opt level: O3

void __thiscall tst_thread::resolve(tst_thread *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  PromiseResolver<int> PVar3;
  QThread *pQVar4;
  bool bVar5;
  char cVar6;
  PromiseDataBase<int,_void_(const_int_&)> *this_00;
  RunFunctionTaskBase<void> *this_01;
  PromiseDataBase<void,_void_()> *this_02;
  QObject *pQVar7;
  char *pcVar8;
  char *pcVar9;
  QPromiseReject<void> *in_R8;
  QSharedData *pQVar10;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  Data *local_d8;
  PromiseResolver<void> resolver_1;
  PromiseResolver<int> resolver;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  QThread **local_a8;
  int *piStack_a0;
  int value;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  QThread *source;
  QThread *target;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_50;
  
  value = -1;
  target = (QThread *)0x0;
  source = (QThread *)0x0;
  this_00 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011bb90;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0011bb28;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar2 = &this_00->super_QSharedData;
  local_50.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011b978;
  local_50.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_50);
  local_50.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011b948;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_50.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar10 = (QSharedData *)(local_50.super__Function_base._M_functor._8_8_ + 8);
    (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_50.super__Function_base._M_functor._8_8_
        != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_50.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar3.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_b8 = (undefined1  [8])QThreadPool::globalInstance();
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  uStack_b0 = (Data *)((ulong)uStack_b0._4_4_ << 0x20);
  this_01 = (RunFunctionTaskBase<void> *)operator_new(0x30);
  this_01->field_0x8 = 1;
  *(undefined ***)this_01 = &PTR_run_0011b9c8;
  QFutureInterfaceBase::QFutureInterfaceBase(&(this_01->promise).super_QFutureInterfaceBase,NoState)
  ;
  *(undefined ***)&this_01->promise = &PTR__QFutureInterfaceBase_0011b9f8;
  *(undefined ***)this_01 = &PTR_run_0011b810;
  *(QThread ***)(this_01 + 1) = &source;
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
   &this_01[1].field_0x8 = PVar3.m_d.d;
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  QtConcurrent::RunFunctionTaskBase<void>::start
            ((QFuture<void> *)&local_88,this_01,(TaskStartParameters *)local_b8);
  if (PVar3.m_d.d == (Data *)0x0) {
    QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)local_88._M_pod_data);
  }
  else {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
    QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)local_88._M_pod_data);
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_02->super_QSharedData = 0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_02->m_lock = 0;
  *(undefined8 *)&this_02->m_settled = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011bae0;
  QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
  this_02->m_settled = false;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ba68;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar10 = &this_02->super_QSharedData;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ba30;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011b918;
  if (this_02 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &this_02->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (this_02 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*this_02->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_b8 = (undefined1  [8])0x0;
    uStack_b0 = (Data *)0x0;
    goto LAB_00105ba7;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_e0.d = (Data *)0x0;
LAB_00105b92:
    local_b8 = (undefined1  [8])resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    uStack_b0 = local_e0.d;
    if (local_e0.d == (Data *)0x0) goto LAB_00105ba7;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_e0 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_00105b92;
  }
  local_b8 = (undefined1  [8])resolver_1.m_d.d;
  LOCK();
  ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  uStack_b0 = local_e0.d;
LAB_00105ba7:
  local_a8 = &target;
  piStack_a0 = &value;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_e0.d = uStack_b0;
  local_d8 = (Data *)local_b8;
  local_88._M_unused._M_object = operator_new(0x20);
  *(undefined1 (*) [8])local_88._M_unused._0_8_ = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    (((QSharedData *)local_b8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_b8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_88._M_unused._0_8_ + 8) = uStack_b0;
  if (uStack_b0 == (Data *)0x0) {
    *(QThread ***)((long)local_88._M_unused._0_8_ + 0x10) = local_a8;
    *(int **)((long)local_88._M_unused._0_8_ + 0x18) = piStack_a0;
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (uStack_b0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (uStack_b0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QThread ***)((long)local_88._M_unused._0_8_ + 0x10) = local_a8;
    *(int **)((long)local_88._M_unused._0_8_ + 0x18) = piStack_a0;
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    if (uStack_b0 != (Data *)0x0) {
      LOCK();
      (uStack_b0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (uStack_b0->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((uStack_b0->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(uStack_b0,0x10);
      }
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    (((QSharedData *)local_b8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_b8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)local_b8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete((void *)local_b8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (this_00,(function<void_(const_int_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_50,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_d8,
             (QPromiseResolve<void> *)&local_e0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher(this_00,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if (local_d8 != (Data *)0x0) {
    LOCK();
    (local_d8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_d8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_d8,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_00);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_00);
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  while (bVar5 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  cVar6 = QTest::qVerify(source != (QThread *)0x0,"source != nullptr","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x30);
  if ((cVar6 != '\0') &&
     (cVar6 = QTest::qVerify(source != target,"source != target","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                             ,0x31), pQVar4 = target, cVar6 != '\0')) {
    pQVar7 = (QObject *)QThread::currentThread();
    pcVar8 = (char *)QTest::toString((QObject *)pQVar4);
    pcVar9 = (char *)QTest::toString(pQVar7);
    cVar6 = QTest::compare_helper
                      (pQVar4 == (QThread *)pQVar7,"Compared QObject pointers are not the same",
                       pcVar8,pcVar9,"target","QThread::currentThread()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                       ,0x32);
    if (cVar6 != '\0') {
      QTest::qCompare(value,0x2a,"value","42",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                      ,0x33);
    }
  }
  return;
}

Assistant:

void tst_thread::resolve()
{
    int value = -1;
    QThread* target = nullptr;
    QThread* source = nullptr;

    QtPromise::QPromise<int>{[&](const QtPromise::QPromiseResolve<int>& resolve) {
        std::ignore = QtConcurrent::run([=, &source]() {
            source = QThread::currentThread();
            resolve(42);
        });
    }}
        .then([&](int res) {
            target = QThread::currentThread();
            value = res;
        })
        .wait();

    QVERIFY(source != nullptr);
    QVERIFY(source != target);
    QCOMPARE(target, QThread::currentThread());
    QCOMPARE(value, 42);
}